

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O0

void __thiscall Memory::CacheAllocator::Unlock(CacheAllocator *this)

{
  char *pcVar1;
  size_t sVar2;
  DWORD local_20;
  DWORD local_1c;
  DWORD oldProtect_1;
  DWORD oldProtect;
  BigBlock *bigBlock;
  CacheAllocator *this_local;
  
  if (((byte)this[0x80] & 1) != 0) {
    bigBlock = (BigBlock *)this;
    for (_oldProtect_1 = *(undefined8 **)(this + 0x10); _oldProtect_1 != (undefined8 *)0x0;
        _oldProtect_1 = (undefined8 *)*_oldProtect_1) {
      pcVar1 = PageAllocation::GetAddress((PageAllocation *)_oldProtect_1[2]);
      sVar2 = PageAllocation::GetSize((PageAllocation *)_oldProtect_1[2]);
      VirtualProtect(pcVar1,sVar2,4,&local_1c);
    }
    for (_oldProtect_1 = *(undefined8 **)(this + 0x18); _oldProtect_1 != (undefined8 *)0x0;
        _oldProtect_1 = (undefined8 *)*_oldProtect_1) {
      pcVar1 = PageAllocation::GetAddress((PageAllocation *)_oldProtect_1[2]);
      sVar2 = PageAllocation::GetSize((PageAllocation *)_oldProtect_1[2]);
      VirtualProtect(pcVar1,sVar2,4,&local_20);
    }
    this[0x80] = (CacheAllocator)0x0;
  }
  return;
}

Assistant:

void CacheAllocator::Unlock()
{
    if (verifiedAllZeroAndLockedDown)
    {
        // restore the pages to read-write before returning to page allocator
        BigBlock *bigBlock = this->bigBlocks;
        while (bigBlock != NULL)
        {
            DWORD oldProtect;
            VirtualProtect(bigBlock->allocation->GetAddress(), bigBlock->allocation->GetSize(), PAGE_READWRITE, &oldProtect);
            bigBlock = bigBlock->nextBigBlock;
        }

        bigBlock = this->fullBlocks;
        while (bigBlock != NULL)
        {
            DWORD oldProtect;
            VirtualProtect(bigBlock->allocation->GetAddress(), bigBlock->allocation->GetSize(), PAGE_READWRITE, &oldProtect);
            bigBlock = bigBlock->nextBigBlock;
        }

        verifiedAllZeroAndLockedDown = false;
    }
}